

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int replace_bytes(uchar *bytes,size_t bytes_len,uchar **bytes_out,size_t *bytes_len_out)

{
  int iVar1;
  uchar *__dest;
  bool bVar2;
  
  iVar1 = -2;
  if (((bytes != (uchar *)0x0) != (bytes_len == 0)) &&
     ((*bytes_out != (uchar *)0x0) != (*bytes_len_out == 0))) {
    if (bytes_len == 0) {
      bVar2 = true;
      __dest = (uchar *)0x0;
    }
    else {
      __dest = (uchar *)wally_malloc(bytes_len);
      if (__dest != (uchar *)0x0) {
        memcpy(__dest,bytes,bytes_len);
      }
      bVar2 = __dest != (uchar *)0x0;
    }
    iVar1 = -3;
    if (bVar2) {
      clear_and_free(*bytes_out,*bytes_len_out);
      *bytes_out = __dest;
      *bytes_len_out = bytes_len;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int replace_bytes(const unsigned char *bytes, size_t bytes_len,
                  unsigned char **bytes_out, size_t *bytes_len_out)
{
    unsigned char *new_bytes = NULL;

    if (BYTES_INVALID(bytes, bytes_len) || BYTES_INVALID(*bytes_out, *bytes_len_out))
        return WALLY_EINVAL;

    /* TODO: Avoid reallocation if new bytes is smaller than the existing one */
    if (!clone_bytes(&new_bytes, bytes, bytes_len))
        return WALLY_ENOMEM;

    clear_and_free(*bytes_out, *bytes_len_out);
    *bytes_out = new_bytes;
    *bytes_len_out = bytes_len;
    return WALLY_OK;
}